

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

RegexMatcher *
Catch::Matchers::Matches
          (RegexMatcher *__return_storage_ptr__,string *regex,CaseSensitive caseSensitivity)

{
  string sStack_38;
  
  std::__cxx11::string::string((string *)&sStack_38,(string *)regex);
  RegexMatcher::RegexMatcher(__return_storage_ptr__,&sStack_38,caseSensitivity);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

RegexMatcher Matches(std::string const& regex, CaseSensitive caseSensitivity) {
        return RegexMatcher(regex, caseSensitivity);
    }